

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O3

TBuiltInParseables *
anon_unknown.dwarf_b4b9b9::CreateBuiltInParseables(TInfoSink *infoSink,EShSource source)

{
  TPoolAllocator *pTVar1;
  TBuiltIns *this;
  
  if (source == EShSourceHlsl) {
    pTVar1 = glslang::GetThreadPoolAllocator();
    this = (TBuiltIns *)glslang::TPoolAllocator::allocate(pTVar1,0x260);
    glslang::TBuiltInParseablesHlsl::TBuiltInParseablesHlsl((TBuiltInParseablesHlsl *)this);
  }
  else if (source == EShSourceGlsl) {
    pTVar1 = glslang::GetThreadPoolAllocator();
    this = (TBuiltIns *)glslang::TPoolAllocator::allocate(pTVar1,0x390);
    glslang::TBuiltIns::TBuiltIns(this);
  }
  else {
    glslang::TInfoSinkBase::message
              (&infoSink->info,EPrefixInternalError,"Unable to determine source language");
    this = (TBuiltIns *)0x0;
  }
  return &this->super_TBuiltInParseables;
}

Assistant:

TBuiltInParseables* CreateBuiltInParseables(TInfoSink& infoSink, EShSource source)
{
    switch (source) {
    case EShSourceGlsl: return new TBuiltIns();              // GLSL builtIns
#ifdef ENABLE_HLSL
    case EShSourceHlsl: return new TBuiltInParseablesHlsl(); // HLSL intrinsics
#endif

    default:
        infoSink.info.message(EPrefixInternalError, "Unable to determine source language");
        return nullptr;
    }
}